

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O0

__type __thiscall
__gnu_cxx::__ops::
_Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/src/exposer.cc:55:18)>
::anon_class_32_1_ba1d80cc_for__M_pred::operator()
          (anon_class_32_1_ba1d80cc_for__M_pred *this,
          unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
          *endpoint)

{
  __type _Var1;
  pointer this_00;
  string *__lhs;
  unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
  *endpoint_local;
  anon_class_32_1_ba1d80cc_for__M_pred *this_local;
  
  this_00 = std::
            unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
            ::operator->(endpoint);
  __lhs = prometheus::detail::Endpoint::GetURI_abi_cxx11_(this_00);
  _Var1 = std::operator==(__lhs,&this->uri);
  return _Var1;
}

Assistant:

detail::Endpoint& Exposer::GetEndpointForUri(const std::string& uri) {
  auto sameUri = [uri](const std::unique_ptr<detail::Endpoint>& endpoint) {
    return endpoint->GetURI() == uri;
  };
  auto it = std::find_if(std::begin(endpoints_), std::end(endpoints_), sameUri);
  if (it != std::end(endpoints_)) {
    return *it->get();
  }

  endpoints_.emplace_back(detail::make_unique<detail::Endpoint>(*server_, uri));
  return *endpoints_.back().get();
}